

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus DecodeBitpOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint in_ESI;
  MCInst *in_RDI;
  DecodeStatus local_4;
  
  if (in_ESI < 0xc) {
    MCOperand_CreateImm0(in_RDI,(ulong)DecodeBitpOperand::Values[in_ESI]);
    local_4 = MCDisassembler_Success;
  }
  else {
    local_4 = MCDisassembler_Fail;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeBitpOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	static const unsigned Values[] = {
		32 /*bpw*/, 1, 2, 3, 4, 5, 6, 7, 8, 16, 24, 32
	};

	if (Val > 11)
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, Values[Val]);
	return MCDisassembler_Success;
}